

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void setup_prune_ref_frame_mask(AV1_COMP *cpi)

{
  int iVar1;
  long in_RDI;
  int i;
  int ref_dist [2];
  MV_REFERENCE_FRAME rf [2];
  int ref_idx;
  int bwd_dist;
  int arf2_dist;
  uint *ref_display_order_hint;
  int cur_frame_display_order_hint;
  AV1_COMMON *cm;
  int local_3c;
  int local_38 [2];
  char local_2e [2];
  int local_2c;
  int local_28;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  long local_8;
  
  if ((((*(byte *)(in_RDI + 0x426d9) & 1) == 0) || (*(int *)(in_RDI + 0x60adc) != 0)) &&
     (*(int *)(in_RDI + 0x71290) != 0)) {
    *(undefined4 *)(in_RDI + 0x9d1f8) = 0x1fffff00;
  }
  else if ((*(int *)(in_RDI + 0x60cb0) == 0) && (1 < *(int *)(in_RDI + 0x60a90))) {
    local_10 = in_RDI + 0x3bf80;
    local_14 = *(int *)(in_RDI + 0x3bf88);
    local_20 = *(long *)(in_RDI + 0x3c068) + 0x28;
    local_8 = in_RDI;
    local_24 = av1_encoder_get_relative_dist(*(int *)(*(long *)(in_RDI + 0x3c068) + 0x3c),local_14);
    local_28 = av1_encoder_get_relative_dist(*(int *)(local_20 + 0x10),local_14);
    for (local_2c = 8; local_2c < 0x1d; local_2c = local_2c + 1) {
      av1_set_ref_frame(local_2e,(MV_REFERENCE_FRAME)local_2c);
      if (((*(uint *)(local_8 + 0x608b8) & (uint)""[local_2e[0]]) != 0) &&
         ((*(uint *)(local_8 + 0x608b8) & (uint)""[local_2e[1]]) != 0)) {
        if (*(int *)(local_8 + 0x71290) == 0) {
          for (local_3c = 0; local_3c < 2; local_3c = local_3c + 1) {
            iVar1 = av1_encoder_get_relative_dist
                              (*(int *)(local_20 + (long)(local_2e[local_3c] + -1) * 4),local_14);
            local_38[local_3c] = iVar1;
          }
          if (0 < local_38[0] == 0 < local_38[1]) {
            *(uint *)(local_8 + 0x9d1f8) =
                 1 << ((byte)local_2c & 0x1f) | *(uint *)(local_8 + 0x9d1f8);
          }
        }
        if (((3 < *(int *)(local_8 + 0x60a90)) &&
            ((((local_2e[0] == '\x06' || (local_2e[1] == '\x06')) &&
              ((*(uint *)(local_8 + 0x608b8) & 0x10) != 0)) && ((0 < local_24 && (0 < local_28))))))
           && (local_28 <= local_24)) {
          *(uint *)(local_8 + 0x9d1f8) = 1 << ((byte)local_2c & 0x1f) | *(uint *)(local_8 + 0x9d1f8)
          ;
        }
      }
    }
  }
  return;
}

Assistant:

static inline void setup_prune_ref_frame_mask(AV1_COMP *cpi) {
  if ((!cpi->oxcf.ref_frm_cfg.enable_onesided_comp ||
       cpi->sf.inter_sf.disable_onesided_comp) &&
      cpi->all_one_sided_refs) {
    // Disable all compound references
    cpi->prune_ref_frame_mask = (1 << MODE_CTX_REF_FRAMES) - (1 << REF_FRAMES);
  } else if (!cpi->sf.rt_sf.use_nonrd_pick_mode &&
             cpi->sf.inter_sf.selective_ref_frame >= 2) {
    AV1_COMMON *const cm = &cpi->common;
    const int cur_frame_display_order_hint =
        cm->current_frame.display_order_hint;
    unsigned int *ref_display_order_hint =
        cm->cur_frame->ref_display_order_hint;
    const int arf2_dist = av1_encoder_get_relative_dist(
        ref_display_order_hint[ALTREF2_FRAME - LAST_FRAME],
        cur_frame_display_order_hint);
    const int bwd_dist = av1_encoder_get_relative_dist(
        ref_display_order_hint[BWDREF_FRAME - LAST_FRAME],
        cur_frame_display_order_hint);

    for (int ref_idx = REF_FRAMES; ref_idx < MODE_CTX_REF_FRAMES; ++ref_idx) {
      MV_REFERENCE_FRAME rf[2];
      av1_set_ref_frame(rf, ref_idx);
      if (!(cpi->ref_frame_flags & av1_ref_frame_flag_list[rf[0]]) ||
          !(cpi->ref_frame_flags & av1_ref_frame_flag_list[rf[1]])) {
        continue;
      }

      if (!cpi->all_one_sided_refs) {
        int ref_dist[2];
        for (int i = 0; i < 2; ++i) {
          ref_dist[i] = av1_encoder_get_relative_dist(
              ref_display_order_hint[rf[i] - LAST_FRAME],
              cur_frame_display_order_hint);
        }

        // One-sided compound is used only when all reference frames are
        // one-sided.
        if ((ref_dist[0] > 0) == (ref_dist[1] > 0)) {
          cpi->prune_ref_frame_mask |= 1 << ref_idx;
        }
      }

      if (cpi->sf.inter_sf.selective_ref_frame >= 4 &&
          (rf[0] == ALTREF2_FRAME || rf[1] == ALTREF2_FRAME) &&
          (cpi->ref_frame_flags & av1_ref_frame_flag_list[BWDREF_FRAME])) {
        // Check if both ALTREF2_FRAME and BWDREF_FRAME are future references.
        if (arf2_dist > 0 && bwd_dist > 0 && bwd_dist <= arf2_dist) {
          // Drop ALTREF2_FRAME as a reference if BWDREF_FRAME is a closer
          // reference to the current frame than ALTREF2_FRAME
          cpi->prune_ref_frame_mask |= 1 << ref_idx;
        }
      }
    }
  }
}